

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line.c
# Opt level: O1

int dwarf_get_string_section_name(Dwarf_Debug dbg,char **section_name_out,Dwarf_Error *error)

{
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_string_section_name()either null or it containsa stale Dwarf_Debug pointer"
                       );
    return 1;
  }
  if (error != (Dwarf_Error *)0x0) {
    *error = (Dwarf_Error)0x0;
  }
  if ((dbg->de_debug_str).dss_size != 0) {
    *section_name_out = (dbg->de_debug_str).dss_name;
    return 0;
  }
  return -1;
}

Assistant:

int
dwarf_get_string_section_name(Dwarf_Debug dbg,
    const char **section_name_out,
    Dwarf_Error * error)
{
    struct Dwarf_Section_s *sec = 0;

    CHECK_DBG(dbg,error,"dwarf_get_string_section_name()");
    /*  ***** BEGIN CODE ***** */
    if (error != NULL) {
        *error = NULL;
    }
    sec = &dbg->de_debug_str;
    if (sec->dss_size == 0) {
        /* We don't have such a  section at all. */
        return DW_DLV_NO_ENTRY;
    }
    *section_name_out = sec->dss_name;
    return DW_DLV_OK;
}